

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void mbedtls_debug_printf_ecdh_internal
               (mbedtls_ssl_context *ssl,int level,char *file,int line,mbedtls_ecdh_context *ecdh,
               mbedtls_debug_ecdh_attr attr)

{
  mbedtls_ecdh_context_mbed *ctx;
  mbedtls_debug_ecdh_attr attr_local;
  mbedtls_ecdh_context *ecdh_local;
  int line_local;
  char *file_local;
  int level_local;
  mbedtls_ssl_context *ssl_local;
  
  if (attr == MBEDTLS_DEBUG_ECDH_Q) {
    mbedtls_debug_print_ecp(ssl,level,file,line,"ECDH: Q",&(ecdh->ctx).mbed_ecdh.Q);
  }
  else if (attr == MBEDTLS_DEBUG_ECDH_QP) {
    mbedtls_debug_print_ecp(ssl,level,file,line,"ECDH: Qp",&(ecdh->ctx).mbed_ecdh.Qp);
  }
  else if (attr == MBEDTLS_DEBUG_ECDH_Z) {
    mbedtls_debug_print_mpi(ssl,level,file,line,"ECDH: z",&(ecdh->ctx).mbed_ecdh.z);
  }
  return;
}

Assistant:

static void mbedtls_debug_printf_ecdh_internal(const mbedtls_ssl_context *ssl,
                                               int level, const char *file,
                                               int line,
                                               const mbedtls_ecdh_context *ecdh,
                                               mbedtls_debug_ecdh_attr attr)
{
#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    const mbedtls_ecdh_context *ctx = ecdh;
#else
    const mbedtls_ecdh_context_mbed *ctx = &ecdh->ctx.mbed_ecdh;
#endif

    switch (attr) {
        case MBEDTLS_DEBUG_ECDH_Q:
            mbedtls_debug_print_ecp(ssl, level, file, line, "ECDH: Q",
                                    &ctx->Q);
            break;
        case MBEDTLS_DEBUG_ECDH_QP:
            mbedtls_debug_print_ecp(ssl, level, file, line, "ECDH: Qp",
                                    &ctx->Qp);
            break;
        case MBEDTLS_DEBUG_ECDH_Z:
            mbedtls_debug_print_mpi(ssl, level, file, line, "ECDH: z",
                                    &ctx->z);
            break;
        default:
            break;
    }
}